

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

MidiEvent * __thiscall smf::MidiFile::addEvent(MidiFile *this,MidiEvent *mfevent)

{
  reference ppMVar1;
  MidiEvent *pMVar2;
  
  if (this->m_theTrackState == 1) {
    MidiEventList::push_back
              (*(this->m_events).
                super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                _M_impl.super__Vector_impl_data._M_start,mfevent);
    ppMVar1 = (this->m_events).
              super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  else {
    ppMVar1 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::at
                        (&this->m_events,(long)mfevent->track);
    MidiEventList::push_back(*ppMVar1,mfevent);
    ppMVar1 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::at
                        (&this->m_events,(long)mfevent->track);
  }
  pMVar2 = MidiEventList::back(*ppMVar1);
  return pMVar2;
}

Assistant:

MidiEvent* MidiFile::addEvent(MidiEvent& mfevent) {
	if (getTrackState() == TRACK_STATE_JOINED) {
		m_events[0]->push_back(mfevent);
		return &m_events[0]->back();
	} else {
		m_events.at(mfevent.track)->push_back(mfevent);
		return &m_events.at(mfevent.track)->back();
	}
}